

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::generateTessEvalShader_abi_cxx11_
          (string *__return_storage_ptr__,TessEvaluationExecutor *this,ShaderSpec *shaderSpec)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  ostringstream local_190 [8];
  ostringstream src;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar2 = glu::getGLSLVersionDeclaration
                     (*(GLSLVersion *)
                       &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  poVar3 = std::operator<<((ostream *)local_190,pcVar2);
  std::operator<<(poVar3,"\n");
  bVar1 = glu::glslVersionIsES
                    (*(GLSLVersion *)
                      &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if ((bVar1) &&
     (*(int *)&(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor < 3)) {
    std::operator<<((ostream *)local_190,"#extension GL_EXT_tessellation_shader : require\n");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_190,
                             (string *)
                             &(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<((ostream *)local_190,"\n");
  std::operator<<((ostream *)local_190,"layout(isolines, equal_spacing) in;\n\n");
  BufferIoExecutor::declareBufferBlocks((ostream *)local_190,(ShaderSpec *)this);
  poVar3 = std::operator<<((ostream *)local_190,"void main (void)\n{\n");
  poVar3 = std::operator<<(poVar3,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar3,
                  "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
                 );
  BufferIoExecutor::generateExecBufferIo((ostream *)local_190,(ShaderSpec *)this,"invocationId");
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TessEvaluationExecutor::generateTessEvalShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\n";

	src << "layout(isolines, equal_spacing) in;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n"
		<< "\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src	<< "}\n";

	return src.str();
}